

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Fillet3.cpp
# Opt level: O1

double __thiscall chrono::ChFunction_Fillet3::Get_y(ChFunction_Fillet3 *this,double x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 extraout_var [56];
  
  if (x <= 0.0) {
    dVar3 = this->y1;
  }
  else if (this->end <= x) {
    dVar3 = this->y2;
  }
  else {
    dVar3 = this->c1;
    auVar4._0_8_ = pow(x,3.0);
    auVar4._8_56_ = extraout_var;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = x;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dVar3;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = x * x * this->c2;
    auVar1 = vfmadd231sd_fma(auVar5,auVar4._0_16_,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = this->c3;
    auVar1 = vfmadd231sd_fma(auVar1,auVar6,auVar2);
    dVar3 = auVar1._0_8_ + this->c4;
  }
  return dVar3;
}

Assistant:

double ChFunction_Fillet3::Get_y(double x) const {
    double ret = 0;
    if (x <= 0)
        return y1;
    if (x >= end)
        return y2;
    ret = c1 * pow(x, 3) + c2 * pow(x, 2) + c3 * x + c4;
    return ret;
}